

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O1

void getaddrinfo_do(getaddrinfo_req *req)

{
  int *piVar1;
  int iVar2;
  undefined8 extraout_RDX;
  int iVar3;
  uv_loop_t *puVar5;
  void *pvVar6;
  void **ppvVar4;
  
  puVar5 = req->loop;
  iVar2 = uv_getaddrinfo(puVar5,&req->handle,getaddrinfo_cb,"localhost",0,0);
  if (iVar2 == 0) {
    return;
  }
  getaddrinfo_do_cold_1();
  pvVar6 = puVar5->handle_queue[0];
  ppvVar4 = puVar5->handle_queue + 1;
  iVar2 = uv_fs_stat(pvVar6,ppvVar4,".",fs_cb);
  iVar3 = (int)ppvVar4;
  if (iVar2 == 0) {
    return;
  }
  fs_do_cold_1();
  if (iVar3 != 0) {
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup();
    piVar1 = (int *)((long)pvVar6 + -0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      fs_do((fs_req *)((long)pvVar6 + -0x18));
      return;
    }
    return;
  }
  uv_freeaddrinfo(extraout_RDX);
  piVar1 = (int *)((long)pvVar6 + -0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)((long)pvVar6 + -0x18));
    return;
  }
  return;
}

Assistant:

static void getaddrinfo_do(struct getaddrinfo_req* req) {
  int r;

  r = uv_getaddrinfo(req->loop,
                     &req->handle,
                     getaddrinfo_cb,
                     "localhost",
                     NULL,
                     NULL);
  ASSERT(r == 0);
}